

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O3

void R_SetupFrame(AActor *actor)

{
  extsector_t *peVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  InterpolationViewer *iview;
  subsector_t *psVar7;
  sector_t_conflict *psVar8;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  secplane_t *psVar13;
  uint uVar14;
  AActor *pAVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  bool unlinked;
  DVector3 campos;
  DAngle camangle;
  bool local_e9;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  double local_b0;
  FQuakeJiggers local_a8;
  DAngle local_38;
  
  if (actor == (AActor *)0x0) {
    I_Error("Tried to render from a NULL actor.");
  }
  paVar9 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)actor->player;
  local_e9 = false;
  camera = actor;
  if (((paVar9 != (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)0x0) &&
      (*(AActor **)paVar9 == actor)) &&
     ((camera = paVar9[0x2f].p, camera == (AActor *)0x0 ||
      ((*(byte *)((long)camera + 0x20) & 0x20) != 0)))) {
    camera = *(AActor **)paVar9;
    paVar9[0x2f] = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)camera;
    if (camera == (AActor *)0x0) {
      I_Error("You lost your body. Bad dehacked work is likely to blame.");
    }
  }
  iview = FindPastViewer(camera);
  iVar5 = (*I_GetTime)(false);
  if (iview->otic < iVar5 && iview->otic != -1) {
    iview->otic = iVar5;
    dVar20 = (iview->New).Pos.Y;
    dVar21 = (iview->New).Pos.Z;
    dVar2 = (iview->New).Angles.Pitch.Degrees;
    dVar3 = (iview->New).Angles.Yaw.Degrees;
    dVar4 = (iview->New).Angles.Roll.Degrees;
    (iview->Old).Pos.X = (iview->New).Pos.X;
    (iview->Old).Pos.Y = dVar20;
    (iview->Old).Angles.Yaw.Degrees = dVar3;
    (iview->Old).Angles.Roll.Degrees = dVar4;
    (iview->Old).Pos.Z = dVar21;
    (iview->Old).Angles.Pitch.Degrees = dVar2;
  }
  pAVar15 = camera;
  if (((paVar9 == (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)0x0) ||
      (gamestate == GS_TITLELEVEL)) ||
     (((*(int *)(paVar9 + 0x1d) & 0x20) == 0 &&
      ((r_deathcamera.Value != true || (0 < camera->health)))))) {
    uVar16 = *(undefined4 *)&(camera->__Pos).Y;
    uVar17 = *(undefined4 *)((long)&(camera->__Pos).Y + 4);
    if (camera->player == (player_t *)0x0) {
      local_e8._0_8_ = (camera->__Pos).Z;
      local_c8 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(camera->__Pos).X;
      uStack_c0 = uVar16;
      uStack_bc = uVar17;
      dVar20 = AActor::GetCameraHeight(camera);
      dVar20 = dVar20 + (double)local_e8._0_8_;
      uVar18 = (undefined4)local_c8;
      uVar19 = local_c8._4_4_;
      uVar16 = uStack_c0;
      uVar17 = uStack_bc;
    }
    else {
      dVar20 = camera->player->viewz;
      uVar18 = *(undefined4 *)&(camera->__Pos).X;
      uVar19 = *(undefined4 *)((long)&(camera->__Pos).X + 4);
    }
    pAVar15 = camera;
    (iview->New).Pos.Z = dVar20;
    *(undefined4 *)&(iview->New).Pos.X = uVar18;
    *(undefined4 *)((long)&(iview->New).Pos.X + 4) = uVar19;
    *(undefined4 *)&(iview->New).Pos.Y = uVar16;
    *(undefined4 *)((long)&(iview->New).Pos.Y + 4) = uVar17;
    viewsector = pAVar15->Sector;
    r_showviewer = false;
  }
  else {
    local_c8 = paVar9;
    psVar7 = R_PointInSubsector(SUB84((iview->Old).Pos.X + 103079215104.0,0),
                                SUB84((iview->Old).Pos.Y + 103079215104.0,0));
    psVar8 = psVar7->sector;
    P_AimCamera(pAVar15,&local_a8.Intensity,&local_38,(sector_t_conflict **)&viewsector,&local_e9);
    (iview->New).Pos.Z = local_a8.Intensity.Z;
    (iview->New).Pos.X = local_a8.Intensity.X;
    (iview->New).Pos.Y = local_a8.Intensity.Y;
    (iview->New).Angles.Yaw.Degrees = local_38.Degrees;
    r_showviewer = true;
    paVar9 = local_c8;
    if ((viewsector->PortalGroup != psVar8->PortalGroup) ||
       ((pAVar15 = camera, local_e9 == true &&
        (dVar20 = local_a8.Intensity.X - (iview->Old).Pos.X,
        dVar21 = local_a8.Intensity.Y - (iview->Old).Pos.Y,
        65536.0 < dVar21 * dVar21 + dVar20 * dVar20)))) {
      iview->otic = iVar5;
      (iview->Old).Pos.Z = local_a8.Intensity.Z;
      (iview->Old).Pos.X = local_a8.Intensity.X;
      (iview->Old).Pos.Y = local_a8.Intensity.Y;
      dVar20 = (iview->New).Angles.Pitch.Degrees;
      (iview->Old).Angles.Roll.Degrees = (iview->New).Angles.Roll.Degrees;
      (iview->Old).Angles.Yaw.Degrees = local_38.Degrees;
      (iview->Old).Angles.Pitch.Degrees = dVar20;
      r_NoInterpolate = true;
      pAVar15 = camera;
    }
  }
  (iview->New).Angles.Roll.Degrees = (pAVar15->Angles).Roll.Degrees;
  (iview->New).Angles.Yaw.Degrees = (pAVar15->Angles).Yaw.Degrees;
  (iview->New).Angles.Pitch.Degrees = (pAVar15->Angles).Pitch.Degrees;
  if (pAVar15->player != (player_t *)0x0) {
    paVar9 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)pAVar15->player;
  }
  if ((iview->otic == -1) || (r_NoInterpolate == true)) {
    if (InterpolationPath.Count != 0) {
      InterpolationPath.Count = 0;
    }
    NoInterpolateView = true;
    iview->otic = iVar5;
  }
  r_TicFracF = I_GetTimeFrac(&r_FrameTime);
  uVar16 = SUB84(r_TicFracF,0);
  uVar17 = (undefined4)((ulong)r_TicFracF >> 0x20);
  if ((cl_capfps.Value != false) || (r_NoInterpolate == true)) {
    r_TicFracF = 1.0;
    uVar16 = 0;
    uVar17 = 0x3ff00000;
  }
  R_InterpolateView((player_t *)paVar9,(double)CONCAT44(uVar17,uVar16),iview);
  R_SetViewAngle();
  FInterpolator::DoInterpolations(&interpolator,r_TicFracF);
  if (((viewsector->planes[1].Flags & 0x1d0U) != 0x100) &&
     (dVar20 = ((viewsector->ceilingplane).normal.Y * ViewPos.Y +
               (viewsector->ceilingplane).D + (viewsector->ceilingplane).normal.X * ViewPos.X) *
               (viewsector->ceilingplane).negiC + -4.0, dVar20 < ViewPos.Z)) {
    ViewPos.Z = dVar20;
  }
  if (((viewsector->planes[0].Flags & 0x1d0U) != 0x100) &&
     (dVar20 = ((viewsector->floorplane).normal.Y * ViewPos.Y +
               (viewsector->floorplane).D + (viewsector->floorplane).normal.X * ViewPos.X) *
               (viewsector->floorplane).negiC + 4.0, ViewPos.Z < dVar20)) {
    ViewPos.Z = dVar20;
  }
  if (paused == 0) {
    local_a8.RollIntensity = 0.0;
    local_a8.RollWave = 0.0;
    local_a8.RelOffset.Y = 0.0;
    local_a8.RelOffset.Z = 0.0;
    local_a8.Offset.Z = 0.0;
    local_a8.RelOffset.X = 0.0;
    local_a8.Offset.X = 0.0;
    local_a8.Offset.Y = 0.0;
    local_a8.RelIntensity.Y = 0.0;
    local_a8.RelIntensity.Z = 0.0;
    local_a8.Intensity.Z = 0.0;
    local_a8.RelIntensity.X = 0.0;
    local_a8.Intensity.X = 0.0;
    local_a8.Intensity.Y = 0.0;
    iVar5 = DEarthquake::StaticGetQuakeIntensities(camera,&local_a8);
    if (0 < iVar5) {
      local_c8 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(double)r_quakeintensity.Value;
      uVar16 = SUB84(local_a8.RollWave,0);
      uVar17 = (undefined4)((ulong)local_a8.RollWave >> 0x20);
      dVar20 = 0.0;
      if ((((local_a8.RollIntensity != 0.0) || (NAN(local_a8.RollIntensity))) ||
          (local_a8.RollWave != 0.0)) || (NAN(local_a8.RollWave))) {
        if ((local_a8.RollIntensity != 0.0) || (NAN(local_a8.RollIntensity))) {
          local_e8._0_8_ = local_a8.RollWave;
          local_d8._0_8_ = local_a8.RollIntensity;
          uVar6 = FRandom::GenRand32(&pr_torchflicker);
          uVar16 = local_e8._0_4_;
          uVar17 = local_e8._4_4_;
          dVar20 = ((double)local_d8._0_8_ + (double)local_d8._0_8_) *
                   (double)uVar6 * 2.3283064365386963e-10 - (double)local_d8._0_8_;
        }
        ViewRoll.Degrees =
             ((double)CONCAT44(uVar17,uVar16) + dVar20) * (double)local_c8 + ViewRoll.Degrees;
      }
      dVar20 = 0.0;
      if (((local_a8.RelIntensity.X != 0.0) || (NAN(local_a8.RelIntensity.X))) ||
         ((local_a8.RelOffset.X != 0.0 || (NAN(local_a8.RelOffset.X))))) {
        if ((local_a8.RelIntensity.X != 0.0) ||
           (local_e8._0_4_ = SUB84(local_a8.RelOffset.X,0),
           local_e8._4_4_ = (int)((ulong)local_a8.RelOffset.X >> 0x20), local_e8._8_4_ = 0,
           local_e8._12_4_ = 0, NAN(local_a8.RelIntensity.X))) {
          local_e8._8_8_ = 0;
          local_e8._0_8_ = local_a8.RelOffset.X;
          local_b0 = local_a8.RelIntensity.X;
          local_d8._0_8_ = (camera->Angles).Yaw.Degrees;
          uVar6 = FRandom::GenRand32(&pr_torchflicker);
          dVar20 = (local_b0 + local_b0) * (double)uVar6 * 2.3283064365386963e-10 - local_b0;
        }
        local_e8._0_8_ =
             ((double)CONCAT44(local_e8._4_4_,local_e8._0_4_) + dVar20) * (double)local_c8;
        dVar20 = FFastTrig::cos(&fasttrig,dVar20);
        local_d8._8_4_ = extraout_XMM0_Dc;
        local_d8._0_8_ = dVar20;
        local_d8._12_4_ = extraout_XMM0_Dd;
        dVar20 = FFastTrig::sin(&fasttrig,dVar20);
        dVar20 = (double)local_e8._0_8_ * dVar20 + ViewPos.Y;
        ViewPos.Y._0_4_ = SUB84(dVar20,0);
        ViewPos.X = (double)local_e8._0_8_ * (double)local_d8._0_8_ + ViewPos.X;
        ViewPos.Y._4_4_ = (int)((ulong)dVar20 >> 0x20);
      }
      dVar20 = 0.0;
      if ((((local_a8.RelIntensity.Y != 0.0) || (NAN(local_a8.RelIntensity.Y))) ||
          (local_a8.RelOffset.Y != 0.0)) || (NAN(local_a8.RelOffset.Y))) {
        if ((local_a8.RelIntensity.Y != 0.0) ||
           (local_e8._0_4_ = SUB84(local_a8.RelOffset.Y,0),
           local_e8._4_4_ = (int)((ulong)local_a8.RelOffset.Y >> 0x20), local_e8._8_4_ = 0,
           local_e8._12_4_ = 0, NAN(local_a8.RelIntensity.Y))) {
          local_e8._8_8_ = 0;
          local_e8._0_8_ = local_a8.RelOffset.Y;
          local_b0 = local_a8.RelIntensity.Y;
          local_d8._0_8_ = (camera->Angles).Yaw.Degrees + 90.0;
          uVar6 = FRandom::GenRand32(&pr_torchflicker);
          dVar20 = (local_b0 + local_b0) * (double)uVar6 * 2.3283064365386963e-10 - local_b0;
        }
        local_e8._0_8_ =
             ((double)CONCAT44(local_e8._4_4_,local_e8._0_4_) + dVar20) * (double)local_c8;
        dVar20 = FFastTrig::cos(&fasttrig,dVar20);
        local_d8._8_4_ = extraout_XMM0_Dc_00;
        local_d8._0_8_ = dVar20;
        local_d8._12_4_ = extraout_XMM0_Dd_00;
        dVar20 = FFastTrig::sin(&fasttrig,dVar20);
        dVar20 = (double)local_e8._0_8_ * dVar20 + ViewPos.Y;
        ViewPos.Y._0_4_ = SUB84(dVar20,0);
        ViewPos.X = (double)local_e8._0_8_ * (double)local_d8._0_8_ + ViewPos.X;
        ViewPos.Y._4_4_ = (int)((ulong)dVar20 >> 0x20);
      }
      uVar16 = SUB84(local_a8.RelOffset.Z,0);
      uVar17 = (undefined4)((ulong)local_a8.RelOffset.Z >> 0x20);
      dVar20 = 0.0;
      if (((local_a8.RelIntensity.Z != 0.0) || (NAN(local_a8.RelIntensity.Z))) ||
         ((local_a8.RelOffset.Z != 0.0 || (NAN(local_a8.RelOffset.Z))))) {
        if ((local_a8.RelIntensity.Z != 0.0) || (NAN(local_a8.RelIntensity.Z))) {
          local_e8._0_8_ = local_a8.RelOffset.Z;
          local_d8._0_8_ = local_a8.RelIntensity.Z;
          uVar6 = FRandom::GenRand32(&pr_torchflicker);
          uVar16 = local_e8._0_4_;
          uVar17 = local_e8._4_4_;
          dVar20 = ((double)local_d8._0_8_ + (double)local_d8._0_8_) *
                   (double)uVar6 * 2.3283064365386963e-10 - (double)local_d8._0_8_;
        }
        ViewPos.Z = ((double)CONCAT44(uVar17,uVar16) + dVar20) * (double)local_c8 + ViewPos.Z;
      }
      uVar16 = SUB84(local_a8.Offset.X,0);
      uVar17 = (undefined4)((ulong)local_a8.Offset.X >> 0x20);
      dVar20 = 0.0;
      if ((((local_a8.Intensity.X != 0.0) || (NAN(local_a8.Intensity.X))) ||
          (local_a8.Offset.X != 0.0)) || (NAN(local_a8.Offset.X))) {
        if ((local_a8.Intensity.X != 0.0) || (NAN(local_a8.Intensity.X))) {
          local_e8._0_8_ = local_a8.Offset.X;
          local_d8._0_8_ = local_a8.Intensity.X;
          uVar6 = FRandom::GenRand32(&pr_torchflicker);
          uVar16 = local_e8._0_4_;
          uVar17 = local_e8._4_4_;
          dVar20 = ((double)local_d8._0_8_ + (double)local_d8._0_8_) *
                   (double)uVar6 * 2.3283064365386963e-10 - (double)local_d8._0_8_;
        }
        ViewPos.X = ((double)CONCAT44(uVar17,uVar16) + dVar20) * (double)local_c8 + ViewPos.X;
      }
      uVar16 = SUB84(local_a8.Offset.Y,0);
      uVar17 = (undefined4)((ulong)local_a8.Offset.Y >> 0x20);
      dVar20 = 0.0;
      if (((local_a8.Intensity.Y != 0.0) || (NAN(local_a8.Intensity.Y))) ||
         ((local_a8.Offset.Y != 0.0 || (NAN(local_a8.Offset.Y))))) {
        if ((local_a8.Intensity.Y != 0.0) || (NAN(local_a8.Intensity.Y))) {
          local_e8._0_8_ = local_a8.Offset.Y;
          local_d8._0_8_ = local_a8.Intensity.Y;
          uVar6 = FRandom::GenRand32(&pr_torchflicker);
          uVar16 = local_e8._0_4_;
          uVar17 = local_e8._4_4_;
          dVar20 = ((double)local_d8._0_8_ + (double)local_d8._0_8_) *
                   (double)uVar6 * 2.3283064365386963e-10 - (double)local_d8._0_8_;
        }
        ViewPos.Y = ((double)CONCAT44(uVar17,uVar16) + dVar20) * (double)local_c8 + ViewPos.Y;
      }
      uVar16 = SUB84(local_a8.Offset.Z,0);
      uVar17 = (undefined4)((ulong)local_a8.Offset.Z >> 0x20);
      dVar20 = 0.0;
      if ((((local_a8.Intensity.Z != 0.0) || (NAN(local_a8.Intensity.Z))) ||
          (local_a8.Offset.Z != 0.0)) || (NAN(local_a8.Offset.Z))) {
        if ((local_a8.Intensity.Z != 0.0) || (NAN(local_a8.Intensity.Z))) {
          local_e8._0_8_ = local_a8.Offset.Z;
          local_d8._0_8_ = local_a8.Intensity.Z;
          uVar6 = FRandom::GenRand32(&pr_torchflicker);
          uVar16 = local_e8._0_4_;
          uVar17 = local_e8._4_4_;
          dVar20 = ((double)local_d8._0_8_ + (double)local_d8._0_8_) *
                   (double)uVar6 * 2.3283064365386963e-10 - (double)local_d8._0_8_;
        }
        ViewPos.Z = ((double)CONCAT44(uVar17,uVar16) + dVar20) * (double)local_c8 + ViewPos.Z;
      }
    }
  }
  if (camera->player == (player_t *)0x0) {
    extralight = 0;
  }
  else {
    extralight = camera->player->extralight;
  }
  peVar1 = viewsector->e;
  uVar6 = (peVar1->XFloor).lightlist.Count;
  if ((ulong)uVar6 == 0) {
    psVar8 = sector_t::GetHeightSec((sector_t_conflict *)viewsector);
    if (psVar8 == (sector_t_conflict *)0x0) goto LAB_0047750b;
    lVar10 = 0x1b0;
    if (-1.52587890625e-05 <=
        (psVar8->floorplane).normal.Z * ViewPos.Z +
        (psVar8->floorplane).normal.X * ViewPos.X + (psVar8->floorplane).normal.Y * ViewPos.Y +
        (psVar8->floorplane).D) {
      lVar10 = (ulong)(ViewPos.Z * (psVar8->ceilingplane).normal.Z +
                       ViewPos.X * (psVar8->ceilingplane).normal.X +
                       ViewPos.Y * (psVar8->ceilingplane).normal.Y + (psVar8->ceilingplane).D <
                      -1.52587890625e-05) * 4 + 0x1b4;
    }
    uVar6 = *(uint *)((long)&psVar8->planes[0].xform.xOffs + lVar10);
    uVar11 = (ulong)uVar6;
    if (uVar11 < 0x1000000) {
      uVar12 = 0;
      if (uVar11 < numfakecmaps) {
        uVar12 = uVar6;
      }
      uVar11 = (ulong)uVar12;
    }
LAB_00477552:
    uVar6 = (uint)uVar11;
    if (R_OldBlend != uVar6) {
      R_OldBlend = uVar6;
      if (0xffffff < uVar6) {
        BaseBlendR = (uint)(uVar11 >> 0x10) & 0xff;
        BaseBlendG = (uint)(uVar11 >> 8) & 0xff;
        BaseBlendB = uVar6 & 0xff;
        BaseBlendA = (float)(int)(uVar11 >> 0x18) / 255.0;
        NormalLight.Maps = realcolormaps;
        goto LAB_0047766a;
      }
      goto LAB_0047756f;
    }
  }
  else {
    lVar10 = 0x50;
    uVar11 = 0;
    do {
      psVar13 = &viewsector->floorplane;
      if (uVar11 < uVar6 - 1) {
        psVar13 = (secplane_t *)
                  ((long)&(((peVar1->XFloor).lightlist.Array)->plane).normal.X + lVar10);
      }
      dVar20 = (psVar13->normal).Z;
      dVar21 = dVar20 * ViewPos.Z +
               (psVar13->normal).X * ViewPos.X + (psVar13->normal).Y * ViewPos.Y + psVar13->D;
      uVar12 = (uint)(1.52587890625e-05 < dVar21);
      if (dVar21 < -1.52587890625e-05) {
        uVar12 = 0xffffffff;
      }
      uVar14 = -uVar12;
      if (0.0 <= dVar20) {
        uVar14 = uVar12;
      }
      if (0 < (int)uVar14) {
        uVar6 = *(uint *)((long)(peVar1->XFloor).lightlist.Array + lVar10 + -0x18);
        uVar12 = (uint)(uVar6 != 0) << 0x1f;
        if (0xffffff < uVar6) {
          uVar12 = uVar6 & 0xff000000;
        }
        uVar11 = (ulong)(uVar6 & 0xffffff | uVar12);
        goto LAB_00477552;
      }
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x50;
    } while (uVar6 != uVar11);
LAB_0047750b:
    if (R_OldBlend != 0) {
      R_OldBlend = 0;
LAB_0047756f:
      NormalLight.Maps = realcolormaps + (R_OldBlend << 0xd);
      BaseBlendB = 0;
      BaseBlendG = 0;
      BaseBlendR = 0;
      BaseBlendA = 0.0;
    }
  }
LAB_0047766a:
  (*Renderer->_vptr_FRenderer[0x12])();
  (*Renderer->_vptr_FRenderer[0x11])(Renderer,paVar9);
  validcount = validcount + 1;
  if ((DFrameBuffer *)RenderTarget != screen) {
    return;
  }
  if (r_clearbuffer.Value == 0) {
    return;
  }
  iVar5 = r_clearbuffer.Value;
  if (r_clearbuffer.Value == 3) {
    uVar6 = I_FPSTime();
    iVar5 = ((uVar6 >> 7 & 1) != 0) + 1;
  }
  if (iVar5 == 4) {
    uVar6 = I_FPSTime();
    uVar6 = uVar6 >> 5;
  }
  else {
    if (iVar5 == 2) {
      uVar11 = (ulong)GPalette.WhiteIndex;
      goto LAB_0047770a;
    }
    if (iVar5 == 1) {
      uVar11 = (ulong)GPalette.BlackIndex;
      goto LAB_0047770a;
    }
    uVar6 = FRandom::GenRand32(&pr_hom);
  }
  uVar11 = (ulong)(uVar6 & 0xff);
LAB_0047770a:
  (*Renderer->_vptr_FRenderer[0xe])(Renderer,uVar11);
  return;
}

Assistant:

void R_SetupFrame (AActor *actor)
{
	if (actor == NULL)
	{
		I_Error ("Tried to render from a NULL actor.");
	}

	player_t *player = actor->player;
	unsigned int newblend;
	InterpolationViewer *iview;
	bool unlinked = false;

	if (player != NULL && player->mo == actor)
	{	// [RH] Use camera instead of viewplayer
		camera = player->camera;
		if (camera == NULL)
		{
			camera = player->camera = player->mo;
		}
	}
	else
	{
		camera = actor;
	}

	if (camera == NULL)
	{
		I_Error ("You lost your body. Bad dehacked work is likely to blame.");
	}

	iview = FindPastViewer (camera);

	int nowtic = I_GetTime (false);
	if (iview->otic != -1 && nowtic > iview->otic)
	{
		iview->otic = nowtic;
		iview->Old = iview->New;
	}

	if (player != NULL && gamestate != GS_TITLELEVEL &&
		((player->cheats & CF_CHASECAM) || (r_deathcamera && camera->health <= 0)))
	{
		sector_t *oldsector = R_PointInSubsector(iview->Old.Pos)->sector;
		// [RH] Use chasecam view
		DVector3 campos;
		DAngle camangle;
		P_AimCamera (camera, campos, camangle, viewsector, unlinked);	// fixme: This needs to translate the angle, too.
		iview->New.Pos = campos;
		iview->New.Angles.Yaw = camangle;
		
		r_showviewer = true;
		// Interpolating this is a very complicated thing because nothing keeps track of the aim camera's movement, so whenever we detect a portal transition
		// it's probably best to just reset the interpolation for this move.
		// Note that this can still cause problems with unusually linked portals
		if (viewsector->PortalGroup != oldsector->PortalGroup || (unlinked && ((iview->New.Pos.XY() - iview->Old.Pos.XY()).LengthSquared()) > 256*256))
		{
			iview->otic = nowtic;
			iview->Old = iview->New;
			r_NoInterpolate = true;
		}
	}
	else
	{
		iview->New.Pos = { camera->Pos().XY(), camera->player ? camera->player->viewz : camera->Z() + camera->GetCameraHeight() };
		viewsector = camera->Sector;
		r_showviewer = false;
	}
	iview->New.Angles = camera->Angles;
	if (camera->player != 0)
	{
		player = camera->player;
	}

	if (iview->otic == -1 || r_NoInterpolate)
	{
		R_ResetViewInterpolation ();
		iview->otic = nowtic;
	}

	r_TicFracF = I_GetTimeFrac (&r_FrameTime);
	if (cl_capfps || r_NoInterpolate)
	{
		r_TicFracF = 1.;
	}
	R_InterpolateView (player, r_TicFracF, iview);

	R_SetViewAngle ();

	interpolator.DoInterpolations (r_TicFracF);

	// Keep the view within the sector's floor and ceiling
	if (viewsector->PortalBlocksMovement(sector_t::ceiling))
	{
		double theZ = viewsector->ceilingplane.ZatPoint(ViewPos) - 4;
		if (ViewPos.Z > theZ)
		{
			ViewPos.Z = theZ;
		}
	}

	if (viewsector->PortalBlocksMovement(sector_t::floor))
	{
		double theZ = viewsector->floorplane.ZatPoint(ViewPos) + 4;
		if (ViewPos.Z < theZ)
		{
			ViewPos.Z = theZ;
		}
	}

	if (!paused)
	{
		FQuakeJiggers jiggers;

		memset(&jiggers, 0, sizeof(jiggers));
		if (DEarthquake::StaticGetQuakeIntensities(camera, jiggers) > 0)
		{
			double quakefactor = r_quakeintensity;
			DAngle an;

			if (jiggers.RollIntensity != 0 || jiggers.RollWave != 0)
			{
				ViewRoll += QuakePower(quakefactor, jiggers.RollIntensity, jiggers.RollWave);
			}
			if (jiggers.RelIntensity.X != 0 || jiggers.RelOffset.X != 0)
			{
				an = camera->Angles.Yaw;
				double power = QuakePower(quakefactor, jiggers.RelIntensity.X, jiggers.RelOffset.X);
				ViewPos += an.ToVector(power);
			}
			if (jiggers.RelIntensity.Y != 0 || jiggers.RelOffset.Y != 0)
			{
				an = camera->Angles.Yaw + 90;
				double power = QuakePower(quakefactor, jiggers.RelIntensity.Y, jiggers.RelOffset.Y);
				ViewPos += an.ToVector(power);
			}
			// FIXME: Relative Z is not relative
			if (jiggers.RelIntensity.Z != 0 || jiggers.RelOffset.Z != 0)
			{
				ViewPos.Z += QuakePower(quakefactor, jiggers.RelIntensity.Z, jiggers.RelOffset.Z);
			}
			if (jiggers.Intensity.X != 0 || jiggers.Offset.X != 0)
			{
				ViewPos.X += QuakePower(quakefactor, jiggers.Intensity.X, jiggers.Offset.X);
			}
			if (jiggers.Intensity.Y != 0 || jiggers.Offset.Y != 0)
			{
				ViewPos.Y += QuakePower(quakefactor, jiggers.Intensity.Y, jiggers.Offset.Y);
			}
			if (jiggers.Intensity.Z != 0 || jiggers.Offset.Z != 0)
			{
				ViewPos.Z += QuakePower(quakefactor, jiggers.Intensity.Z, jiggers.Offset.Z);
			}
		}
	}

	extralight = camera->player ? camera->player->extralight : 0;

	// killough 3/20/98, 4/4/98: select colormap based on player status
	// [RH] Can also select a blend
	newblend = 0;

	TArray<lightlist_t> &lightlist = viewsector->e->XFloor.lightlist;
	if (lightlist.Size() > 0)
	{
		for(unsigned int i = 0; i < lightlist.Size(); i++)
		{
			secplane_t *plane;
			int viewside;
			plane = (i < lightlist.Size()-1) ? &lightlist[i+1].plane : &viewsector->floorplane;
			viewside = plane->PointOnSide(ViewPos);
			// Reverse the direction of the test if the plane was downward facing.
			// We want to know if the view is above it, whatever its orientation may be.
			if (plane->fC() < 0)
				viewside = -viewside;
			if (viewside > 0)
			{
				// 3d floor 'fog' is rendered as a blending value
				PalEntry blendv = lightlist[i].blend;

				// If no alpha is set, use 50%
				if (blendv.a==0 && blendv!=0) blendv.a=128;
				newblend = blendv.d;
				break;
			}
		}
	}
	else
	{
		const sector_t *s = viewsector->GetHeightSec();
		if (s != NULL)
		{
			newblend = s->floorplane.PointOnSide(ViewPos) < 0
				? s->bottommap
				: s->ceilingplane.PointOnSide(ViewPos) < 0
				? s->topmap
				: s->midmap;
			if (APART(newblend) == 0 && newblend >= numfakecmaps)
				newblend = 0;
		}
	}

	// [RH] Don't override testblend unless entering a sector with a
	//		blend different from the previous sector's. Same goes with
	//		NormalLight's maps pointer.
	if (R_OldBlend != newblend)
	{
		R_OldBlend = newblend;
		if (APART(newblend))
		{
			BaseBlendR = RPART(newblend);
			BaseBlendG = GPART(newblend);
			BaseBlendB = BPART(newblend);
			BaseBlendA = APART(newblend) / 255.f;
			NormalLight.Maps = realcolormaps;
		}
		else
		{
			NormalLight.Maps = realcolormaps + NUMCOLORMAPS*256*newblend;
			BaseBlendR = BaseBlendG = BaseBlendB = 0;
			BaseBlendA = 0.f;
		}
	}

	Renderer->CopyStackedViewParameters();
	Renderer->SetupFrame(player);

	validcount++;

	if (RenderTarget == screen && r_clearbuffer != 0)
	{
		int color;
		int hom = r_clearbuffer;

		if (hom == 3)
		{
			hom = ((I_FPSTime() / 128) & 1) + 1;
		}
		if (hom == 1)
		{
			color = GPalette.BlackIndex;
		}
		else if (hom == 2)
		{
			color = GPalette.WhiteIndex;
		}
		else if (hom == 4)
		{
			color = (I_FPSTime() / 32) & 255;
		}
		else
		{
			color = pr_hom();
		}
		Renderer->ClearBuffer(color);
	}
}